

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O2

TimeProcessingResult __thiscall
helics::BaseTimeCoordinator::processTimeMessage(BaseTimeCoordinator *this,ActionMessage *cmd)

{
  TimeProcessingResult TVar1;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  checkRes;
  ActionMessage error;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ActionMessage local_d8;
  
  if (((uint)cmd->messageAction < 10) &&
     ((0x3c8U >> (cmd->messageAction & cmd_terminate_immediately) & 1) != 0)) {
    (*this->_vptr_BaseTimeCoordinator[7])(this,(ulong)(uint)(cmd->source_id).gid);
  }
  TVar1 = TimeDependencies::updateTime(&this->dependencies,cmd);
  if (TVar1 == PROCESSED_AND_CHECK) {
    TimeDependencies::checkForIssues_abi_cxx11_
              ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_100,&this->dependencies,false);
    if (local_100._0_4_ != 0) {
      ActionMessage::ActionMessage(&local_d8,cmd_global_error);
      local_d8.dest_id.gid = 0;
      local_d8.source_id.gid = (this->mSourceId).gid;
      local_d8.messageID = local_100._0_4_;
      SmallBuffer::operator=
                (&local_d8.payload,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_100 + 8));
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                (&this->sendMessageFunction,&local_d8);
      ActionMessage::~ActionMessage(&local_d8);
    }
    std::__cxx11::string::~string((string *)(local_100 + 8));
  }
  return TVar1;
}

Assistant:

TimeProcessingResult BaseTimeCoordinator::processTimeMessage(const ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_BROKER:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_CORE:
        case CMD_BROADCAST_DISCONNECT:
            removeDependent(cmd.source_id);
            break;
        default:
            break;
    }
    auto procRes = dependencies.updateTime(cmd);
    if (procRes == TimeProcessingResult::PROCESSED_AND_CHECK) {
        auto checkRes = dependencies.checkForIssues(false);
        if (checkRes.first != 0) {
            ActionMessage error(CMD_GLOBAL_ERROR);
            error.dest_id = parent_broker_id;
            error.source_id = mSourceId;
            error.messageID = checkRes.first;
            error.payload = checkRes.second;
            sendMessageFunction(error);
        }
    }
    return procRes;
}